

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_plm_fpu.cpp
# Opt level: O3

void EBPLM::PredictStateOnYFace
               (Box *yebox,int ncomp,Array4<double> *Imy,Array4<double> *Ipy,Array4<const_double> *q
               ,Array4<const_double> *vmac,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *vfrac,Array4<const_double> *fcx,Array4<const_double> *fcy,
               Array4<const_double> *fcz,Array4<const_double> *ccc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc,
               bool is_velocity)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  BCRec *bcrec;
  long lVar30;
  double *pdVar31;
  double *pdVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  double *pdVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  double *pdVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  double *pdVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  double *pdVar50;
  long lVar51;
  long lVar52;
  EBCellFlag *pEVar53;
  long lVar54;
  long lVar55;
  double *pdVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  double *pdVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  double *pdVar64;
  long lVar65;
  long lVar66;
  undefined8 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  int iVar80;
  pair<bool,_bool> pVar81;
  pair<bool,_bool> pVar82;
  pair<bool,_bool> pVar83;
  int kk_4;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  long lVar90;
  long lVar91;
  long lVar92;
  uint uVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  ulong uVar97;
  long lVar98;
  long lVar99;
  ulong uVar100;
  long lVar101;
  long lVar102;
  long lVar103;
  Long *pLVar104;
  int iVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  long lVar109;
  long lVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  long lVar114;
  long lVar115;
  long lVar116;
  long lVar117;
  long lVar118;
  long lVar119;
  long lVar120;
  long lVar121;
  double **ppdVar122;
  int iVar123;
  int cuts_y;
  int iVar124;
  int iVar125;
  int iVar126;
  long lVar127;
  long lVar128;
  int iVar129;
  long lVar130;
  int iVar131;
  uint uVar132;
  int iVar133;
  long lVar134;
  long lVar135;
  long lVar136;
  long lVar137;
  long lVar138;
  long lVar139;
  long lVar140;
  long lVar141;
  long lVar142;
  long lVar143;
  char cVar144;
  uint uVar145;
  long lVar146;
  long lVar147;
  long lVar148;
  long lVar149;
  double *pdVar150;
  double *pdVar151;
  double *pdVar152;
  long lVar153;
  long lVar154;
  double *pdVar155;
  double *pdVar156;
  long lVar157;
  long lVar158;
  double *pdVar159;
  double *pdVar160;
  long lVar161;
  long lVar162;
  long lVar163;
  long lVar164;
  int jj;
  int iVar165;
  long lVar166;
  long lVar167;
  long lVar168;
  long lVar169;
  long lVar170;
  long lVar171;
  long lVar172;
  bool bVar173;
  int iVar174;
  int iVar175;
  int iVar176;
  long lVar177;
  long lVar178;
  long lVar179;
  char cVar180;
  int iVar181;
  double *pdVar182;
  double *pdVar183;
  bool bVar184;
  ulong uVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  ulong uVar191;
  double dVar192;
  double dVar193;
  double dVar195;
  undefined1 auVar194 [16];
  ulong uVar196;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  Real delta_y;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  int cuts_x;
  Real delta_z;
  Real delta_x;
  Real A [27] [3];
  Real du [27];
  double *local_988;
  double local_8e8;
  ulong local_880;
  anon_class_688_19_b0541dda local_3b8;
  double adStack_108 [27];
  
  dVar186 = dt / (geom->super_CoordSys).dx[1];
  iVar181 = (geom->domain).smallend.vect[0];
  bcrec = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
          super__Vector_impl_data._M_start;
  iVar165 = (geom->domain).smallend.vect[1];
  iVar176 = (geom->domain).bigend.vect[0];
  iVar3 = (geom->domain).bigend.vect[1];
  pVar81 = anon_unknown.dwarf_65db2b::has_extdir_or_ho(bcrec,ncomp,0);
  pVar82 = anon_unknown.dwarf_65db2b::has_extdir_or_ho(bcrec,ncomp,1);
  iVar4 = (geom->domain).smallend.vect[2];
  iVar5 = (geom->domain).bigend.vect[2];
  pVar83 = anon_unknown.dwarf_65db2b::has_extdir_or_ho(bcrec,ncomp,2);
  if ((((((((ushort)pVar81 & 1) == 0) || (iVar181 < (yebox->smallend).vect[0] + -1)) &&
        (iVar6 = (yebox->bigend).vect[0], iVar6 < iVar176 || ((ushort)pVar81 >> 8 & 1) == 0)) &&
       ((((ushort)pVar83 & 1) == 0 || (iVar4 < (yebox->smallend).vect[2] + -1)))) &&
      (iVar7 = (yebox->bigend).vect[2], iVar7 < iVar5 || ((ushort)pVar83 >> 8 & 1) == 0)) &&
     (((((ushort)pVar82 & 1) == 0 || (iVar165 < (yebox->smallend).vect[1] + -1)) &&
      (iVar8 = (yebox->bigend).vect[1], iVar8 < iVar3 || ((ushort)pVar82 >> 8 & 1) == 0)))) {
    if (0 < ncomp) {
      lVar30 = ccc->nstride;
      iVar181 = (ccc->begin).x;
      lVar94 = (long)iVar181;
      pdVar31 = ccc->p;
      pdVar32 = q->p;
      lVar33 = q->jstride;
      lVar34 = q->kstride;
      lVar35 = q->nstride;
      iVar165 = (q->begin).x;
      lVar95 = (long)iVar165;
      iVar176 = (q->begin).y;
      lVar161 = (long)iVar176;
      iVar3 = (q->begin).z;
      lVar162 = (long)iVar3;
      lVar36 = ccc->jstride;
      lVar37 = ccc->kstride;
      iVar4 = (ccc->begin).y;
      iVar5 = (ccc->begin).z;
      pdVar38 = fcz->p;
      lVar39 = fcz->jstride;
      lVar40 = fcz->kstride;
      lVar41 = fcz->nstride;
      iVar9 = (fcz->begin).z;
      lVar166 = (long)(fcz->begin).y;
      lVar167 = (long)(fcz->begin).x;
      pdVar42 = fcy->p;
      lVar43 = fcy->jstride;
      lVar44 = fcy->kstride;
      lVar45 = fcy->nstride;
      iVar10 = (fcy->begin).y;
      iVar11 = (fcy->begin).z;
      lVar168 = (long)(fcy->begin).x;
      pdVar46 = fcx->p;
      lVar47 = fcx->jstride;
      lVar48 = fcx->kstride;
      lVar49 = fcx->nstride;
      iVar126 = (fcx->begin).z;
      lVar169 = (long)(fcx->begin).y;
      iVar12 = (fcx->begin).x;
      pdVar50 = vfrac->p;
      lVar51 = vfrac->jstride;
      lVar52 = vfrac->kstride;
      iVar13 = (vfrac->begin).y;
      lVar170 = (long)iVar13;
      uVar14 = (vfrac->begin).z;
      lVar171 = (long)(int)uVar14;
      uVar15 = (vfrac->begin).x;
      lVar127 = (long)(int)uVar15;
      pEVar53 = flag->p;
      lVar54 = flag->jstride;
      lVar55 = flag->kstride;
      iVar16 = (flag->begin).z;
      lVar177 = (long)(flag->begin).y;
      iVar17 = (flag->begin).x;
      pdVar56 = Ipy->p;
      lVar57 = Ipy->jstride;
      lVar58 = Ipy->kstride;
      lVar59 = Ipy->nstride;
      iVar18 = (Ipy->begin).z;
      uVar19 = (Ipy->begin).y;
      iVar20 = (Ipy->begin).x;
      pdVar60 = Imy->p;
      lVar61 = Imy->jstride;
      lVar62 = Imy->kstride;
      lVar63 = Imy->nstride;
      iVar21 = (Imy->begin).z;
      iVar22 = (Imy->begin).y;
      iVar23 = (Imy->begin).x;
      pdVar64 = vmac->p;
      lVar65 = vmac->jstride;
      lVar66 = vmac->kstride;
      iVar24 = (vmac->begin).z;
      iVar25 = (vmac->begin).y;
      lVar146 = (long)(vmac->begin).x;
      iVar26 = (yebox->smallend).vect[2];
      iVar27 = (yebox->smallend).vect[1];
      iVar28 = (yebox->smallend).vect[0];
      lVar163 = (long)iVar28;
      local_880 = 0;
      do {
        if (iVar26 <= iVar7) {
          lVar96 = local_880 * lVar35;
          lVar92 = (long)iVar26;
          do {
            if (iVar8 < iVar27) {
              uVar97 = lVar92 + 1U & 0xffffffff;
            }
            else {
              lVar98 = (lVar92 - iVar16) * lVar55;
              uVar97 = lVar92 + 1;
              lVar128 = (lVar92 - lVar171) * lVar52;
              lVar99 = (lVar92 - lVar162) * lVar34;
              lVar157 = (lVar92 - iVar24) * lVar66;
              lVar106 = (lVar92 - iVar11) * lVar44;
              lVar107 = (lVar92 - iVar5) * lVar37;
              iVar84 = (int)lVar92;
              iVar105 = iVar84 - iVar3;
              lVar108 = iVar105 * lVar34;
              lVar109 = ((lVar92 + -1) - lVar171) * lVar52;
              lVar110 = (uVar97 - lVar171) * lVar52;
              lVar178 = ((lVar92 + -1) - lVar162) * lVar34;
              lVar111 = (uVar97 - lVar162) * lVar34;
              lVar112 = (lVar92 - iVar126) * lVar48;
              lVar153 = ((int)uVar97 - iVar9) * lVar40;
              lVar154 = (lVar92 - iVar9) * lVar40;
              lVar113 = (int)(~uVar14 + iVar84) * lVar52;
              lVar114 = (int)((int)uVar97 - uVar14) * lVar52;
              lVar134 = (~(long)iVar5 + lVar92) * lVar37;
              lVar179 = (long)iVar27;
              do {
                if (iVar6 < iVar28) {
                  uVar100 = lVar179 + 1U & 0xffffffff;
                }
                else {
                  lVar101 = (lVar179 - lVar170) * lVar51;
                  lVar2 = lVar179 + -1;
                  lVar115 = (lVar2 - lVar170) * lVar51;
                  lVar90 = lVar179 + -2;
                  lVar116 = (lVar90 - lVar170) * lVar51;
                  uVar100 = lVar179 + 1;
                  lVar117 = (uVar100 - lVar170) * lVar51;
                  lVar118 = (lVar179 - lVar161) * lVar33;
                  lVar147 = (lVar179 - iVar25) * lVar65;
                  lVar148 = (lVar2 - lVar161) * lVar33;
                  lVar149 = (uVar100 - lVar161) * lVar33;
                  lVar164 = (lVar90 - lVar161) * lVar33;
                  lVar135 = (lVar179 - iVar10) * lVar43;
                  lVar136 = (lVar179 - iVar4) * lVar36;
                  iVar174 = (int)lVar179;
                  iVar131 = iVar174 - iVar176;
                  lVar137 = iVar131 * lVar33;
                  iVar124 = (int)uVar100;
                  lVar138 = (lVar179 - lVar169) * lVar47;
                  lVar139 = (lVar179 - lVar166) * lVar39;
                  lVar140 = (iVar124 - iVar13) * lVar51;
                  lVar141 = ((int)lVar90 - iVar13) * lVar51;
                  lVar130 = ((int)lVar90 - iVar176) * lVar33;
                  iVar85 = (int)lVar2 - iVar4;
                  iVar86 = (int)lVar2 - iVar176;
                  lVar119 = iVar86 * lVar33;
                  lVar120 = (lVar2 - lVar169) * lVar47;
                  lVar158 = (lVar2 - lVar166) * lVar39;
                  lVar102 = (~(long)iVar4 + lVar179) * lVar36;
                  lVar90 = lVar163 + lVar134 + lVar102;
                  pdVar150 = pdVar31 + ((lVar102 + lVar134 + lVar30 + lVar163 + -1) - lVar94);
                  pdVar155 = pdVar31 + ((lVar30 * 2 + lVar90 + -1) - lVar94);
                  pdVar159 = pdVar31 + ((lVar90 + -1) - lVar94);
                  lVar90 = lVar163;
                  iVar129 = (iVar28 + -1) - iVar165;
                  iVar80 = (iVar28 + -1) - iVar181;
                  do {
                    lVar102 = lVar90 - iVar17;
                    uVar29 = pEVar53[lVar98 + (lVar179 - lVar177) * lVar54 + lVar102].flag;
                    dVar187 = 0.0;
                    dVar214 = 0.0;
                    if ((short)uVar29 < 0) {
                      lVar142 = lVar90 - lVar127;
                      dVar211 = pdVar50[lVar101 + lVar142 + lVar128];
                      dVar214 = 1.0;
                      iVar87 = (int)lVar90;
                      if ((dVar211 != 1.0) || (NAN(dVar211))) {
LAB_0042c6c5:
                        lVar103 = lVar90 - lVar168;
                        dVar192 = pdVar42[lVar106 + lVar135 + lVar103];
                        dVar205 = (pdVar42 + lVar106 + lVar135 + lVar103)[lVar45];
                        lVar91 = lVar90 - lVar94;
                        dVar209 = pdVar31[lVar107 + lVar136 + lVar91 + lVar30];
                        dVar215 = pdVar31[lVar107 + lVar136 + lVar91];
                        dVar200 = pdVar31[lVar107 + lVar136 + lVar91 + lVar30 * 2];
                        lVar121 = (long)(iVar87 - iVar165);
                        dVar213 = pdVar32[lVar137 + lVar121 + lVar108 + lVar96];
                        dVar193 = pdVar32[lVar148 + lVar108 + lVar96 + lVar121];
                        lVar91 = -1;
                        cVar144 = '\x05';
                        lVar143 = 0;
                        pdVar151 = pdVar150;
                        pdVar160 = pdVar159;
                        pdVar182 = pdVar155;
                        do {
                          lVar172 = -1;
                          pdVar152 = pdVar151;
                          pdVar156 = pdVar160;
                          pdVar183 = pdVar182;
                          cVar180 = cVar144;
                          do {
                            iVar133 = (int)lVar143;
                            ppdVar122 = &local_3b8.q.p + (long)iVar133 * 3;
                            lVar143 = 0;
                            do {
                              iVar88 = (int)lVar143 + -1;
                              if ((((int)lVar172 == 0 && (int)lVar91 == 0) && iVar88 == 0) ||
                                 ((1 << (cVar180 + (char)lVar143 & 0x1fU) & uVar29) == 0)) {
                                *ppdVar122 = (double *)0x0;
                                ppdVar122[1] = (double *)0x0;
                                ppdVar122[2] = (double *)0x0;
                              }
                              else {
                                dVar187 = pdVar152[lVar143];
                                *ppdVar122 = (double *)
                                             ((pdVar156[lVar143] + (double)iVar88) - dVar215);
                                ppdVar122[1] = (double *)
                                               ((dVar187 + (double)(int)lVar172) - dVar209);
                                ppdVar122[2] = (double *)
                                               ((pdVar183[lVar143] + (double)(int)lVar91) - dVar200)
                                ;
                              }
                              lVar143 = lVar143 + 1;
                              ppdVar122 = ppdVar122 + 3;
                            } while (lVar143 != 3);
                            lVar172 = lVar172 + 1;
                            pdVar183 = pdVar183 + lVar36;
                            pdVar152 = pdVar152 + lVar36;
                            pdVar156 = pdVar156 + lVar36;
                            cVar180 = cVar180 + '\x03';
                            lVar143 = (long)iVar133 + 3;
                          } while (lVar172 != 2);
                          lVar91 = lVar91 + 1;
                          pdVar182 = pdVar182 + lVar37;
                          pdVar151 = pdVar151 + lVar37;
                          pdVar160 = pdVar160 + lVar37;
                          cVar144 = cVar144 + '\t';
                          lVar143 = (long)iVar133 + 3;
                        } while (lVar91 != 2);
                        lVar91 = -1;
                        cVar144 = '\x05';
                        lVar143 = 0;
                        do {
                          lVar172 = -1;
                          cVar180 = cVar144;
                          do {
                            iVar133 = (int)lVar143;
                            lVar143 = 0;
                            do {
                              dVar187 = 0.0;
                              if (((int)lVar143 != 1 || ((int)lVar172 != 0 || (int)lVar91 != 0)) &&
                                 ((1 << (cVar180 + (char)lVar143 & 0x1fU) & uVar29) != 0)) {
                                dVar187 = pdVar32[lVar96 + (iVar105 + (int)lVar91) * lVar34 +
                                                           (iVar131 + (int)lVar172) * lVar33 +
                                                           (long)(iVar129 + (int)lVar143)] - dVar213
                                ;
                              }
                              adStack_108[iVar133 + lVar143] = dVar187;
                              lVar143 = lVar143 + 1;
                            } while (lVar143 != 3);
                            lVar172 = lVar172 + 1;
                            cVar180 = cVar180 + '\x03';
                            lVar143 = (long)iVar133 + 3;
                          } while (lVar172 != 2);
                          lVar91 = lVar91 + 1;
                          cVar144 = cVar144 + '\t';
                          lVar143 = (long)iVar133 + 3;
                        } while (lVar91 != 2);
                        dVar205 = dVar205 - dVar200;
                        dVar199 = 0.0;
                        dVar201 = 0.0;
                        dVar207 = 0.0;
                        pLVar104 = &local_3b8.q.kstride;
                        lVar91 = 0;
                        dVar187 = 0.0;
                        dVar195 = 0.0;
                        dVar210 = 0.0;
                        dVar212 = 0.0;
                        dVar203 = 0.0;
                        dVar204 = 0.0;
                        do {
                          pdVar151 = ((Array4<const_double> *)(pLVar104 + -2))->p;
                          dVar206 = (double)pLVar104[-1];
                          dVar188 = (double)*pLVar104;
                          dVar202 = adStack_108[lVar91];
                          dVar203 = dVar203 + dVar206 * (double)pLVar104[-1];
                          dVar204 = dVar204 + (double)pdVar151 * (double)*pLVar104;
                          dVar207 = dVar207 + dVar188 * dVar188;
                          dVar210 = dVar210 + dVar202 * (double)pdVar151;
                          dVar212 = dVar212 + (double)pdVar151 * (double)pdVar151;
                          dVar199 = dVar199 + dVar202 * dVar206;
                          dVar201 = dVar201 + dVar206 * (double)pdVar151;
                          dVar187 = dVar187 + dVar188 * (double)pLVar104[-1];
                          dVar195 = dVar195 + dVar202 * (double)*pLVar104;
                          lVar91 = lVar91 + 1;
                          pLVar104 = pLVar104 + 3;
                        } while (lVar91 != 0x1b);
                        dVar206 = dVar201 * dVar207 - dVar204 * dVar187;
                        dVar202 = dVar201 * dVar195 - dVar204 * dVar199;
                        dVar188 = dVar201 * dVar187 + dVar204 * -dVar203;
                        dVar208 = dVar207 * dVar203 - dVar187 * dVar187;
                        dVar207 = dVar207 * dVar199 - dVar187 * dVar195;
                        auVar197._0_8_ =
                             dVar204 * (dVar199 * dVar187 - dVar195 * dVar203) +
                             (dVar210 * dVar208 - dVar207 * dVar201);
                        auVar197._8_8_ = dVar204 * dVar202 + (dVar212 * dVar207 - dVar206 * dVar210)
                        ;
                        dVar204 = dVar188 * dVar204 + (dVar208 * dVar212 - dVar206 * dVar201);
                        auVar198._8_8_ = dVar204;
                        auVar198._0_8_ = dVar204;
                        auVar198 = divpd(auVar197,auVar198);
                        dVar204 = (dVar188 * dVar210 +
                                  ((dVar195 * dVar203 + -dVar199 * dVar187) * dVar212 -
                                  dVar202 * dVar201)) / dVar204;
                        dVar195 = auVar198._0_8_;
                        dVar199 = auVar198._8_8_;
                        if ((dVar211 == 1.0) && (!NAN(dVar211))) {
                          if ((pdVar50[lVar101 + lVar128 + ((lVar90 + -1) - lVar127)] == 1.0) &&
                             (!NAN(pdVar50[lVar101 + lVar128 + ((lVar90 + -1) - lVar127)]))) {
                            if ((pdVar50[lVar101 + lVar128 + ((lVar90 + 1) - lVar127)] == 1.0) &&
                               (!NAN(pdVar50[lVar101 + lVar128 + ((lVar90 + 1) - lVar127)]))) {
                              dVar203 = dVar213 - pdVar32[lVar137 + lVar108 + lVar96 + ((lVar90 + -1
                                                                                        ) - lVar95)]
                              ;
                              dVar207 = pdVar32[lVar137 + lVar108 + lVar96 + ((lVar90 + 1) - lVar95)
                                               ] - dVar213;
                              dVar203 = dVar203 + dVar203;
                              dVar207 = dVar207 + dVar207;
                              dVar187 = (pdVar32[lVar137 + lVar108 + lVar96 + ((lVar90 + 1) - lVar95
                                                                              )] -
                                        pdVar32[lVar137 + lVar108 + lVar96 + ((lVar90 + -1) - lVar95
                                                                             )]) * 0.5;
                              dVar201 = ABS(dVar203);
                              uVar185 = -(ulong)(0.0 < dVar187);
                              dVar187 = ABS(dVar187);
                              dVar195 = ABS(dVar207);
                              if (dVar201 <= dVar187) {
                                dVar187 = dVar201;
                              }
                              if (dVar187 <= dVar195) {
                                dVar195 = dVar187;
                              }
                              uVar191 = -(ulong)(0.0 < dVar203 * dVar207) & (ulong)dVar195;
                              dVar195 = (double)(~uVar185 & (uVar191 ^ 0x8000000000000000) |
                                                uVar185 & uVar191);
                            }
                          }
                          if ((((pdVar50[lVar115 + lVar128 + lVar142] == 1.0) &&
                               (!NAN(pdVar50[lVar115 + lVar128 + lVar142]))) &&
                              (pdVar50[lVar128 + lVar117 + lVar142] == 1.0)) &&
                             (!NAN(pdVar50[lVar128 + lVar117 + lVar142]))) {
                            dVar203 = pdVar32[lVar149 + lVar108 + lVar96 + lVar121] - dVar213;
                            dVar201 = (dVar213 - dVar193) + (dVar213 - dVar193);
                            dVar203 = dVar203 + dVar203;
                            dVar199 = (pdVar32[lVar149 + lVar108 + lVar96 + lVar121] - dVar193) *
                                      0.5;
                            dVar207 = ABS(dVar201);
                            uVar185 = -(ulong)(0.0 < dVar199);
                            dVar199 = ABS(dVar199);
                            dVar187 = ABS(dVar203);
                            if (dVar207 <= dVar199) {
                              dVar199 = dVar207;
                            }
                            if (dVar199 <= dVar187) {
                              dVar187 = dVar199;
                            }
                            uVar191 = -(ulong)(0.0 < dVar201 * dVar203) & (ulong)dVar187;
                            dVar199 = (double)(~uVar185 & (uVar191 ^ 0x8000000000000000) |
                                              uVar185 & uVar191);
                          }
                          if (((pdVar50[lVar101 + lVar142 + lVar109] == 1.0) &&
                              (!NAN(pdVar50[lVar101 + lVar142 + lVar109]))) &&
                             ((pdVar50[lVar101 + lVar142 + lVar110] == 1.0 &&
                              (!NAN(pdVar50[lVar101 + lVar142 + lVar110]))))) {
                            dVar203 = dVar213 - pdVar32[lVar137 + lVar121 + lVar178 + lVar96];
                            dVar204 = pdVar32[lVar137 + lVar121 + lVar111 + lVar96] - dVar213;
                            dVar203 = dVar203 + dVar203;
                            dVar204 = dVar204 + dVar204;
                            dVar201 = (pdVar32[lVar137 + lVar121 + lVar111 + lVar96] -
                                      pdVar32[lVar137 + lVar121 + lVar178 + lVar96]) * 0.5;
                            dVar207 = ABS(dVar203);
                            uVar185 = -(ulong)(0.0 < dVar201);
                            dVar201 = ABS(dVar201);
                            dVar187 = ABS(dVar204);
                            if (dVar207 <= dVar201) {
                              dVar201 = dVar207;
                            }
                            if (dVar201 <= dVar187) {
                              dVar187 = dVar201;
                            }
                            uVar191 = -(ulong)(0.0 < dVar203 * dVar204) & (ulong)dVar187;
                            dVar204 = (double)(~uVar185 & (uVar191 ^ 0x8000000000000000) |
                                              uVar185 & uVar191);
                          }
                        }
                        dVar187 = dVar193;
                        if (dVar213 <= dVar193) {
                          dVar187 = dVar213;
                        }
                        if (dVar193 <= dVar213) {
                          dVar193 = dVar213;
                        }
                        dVar192 = dVar192 - dVar215;
                        iVar89 = 0;
                        iVar133 = 0;
                        iVar125 = 0;
                        iVar88 = 0;
                        uVar145 = 0xffffffff;
                        do {
                          uVar93 = uVar145 + 1;
                          uVar132 = 0xffffffff;
                          iVar175 = iVar89;
                          do {
                            uVar1 = uVar132 + 1;
                            iVar123 = 5;
                            do {
                              if (((uVar29 >> (iVar123 + iVar175 & 0x1fU) & 1) != 0) &&
                                 ((iVar123 != 6 || uVar132 != 0) || uVar145 != 0)) {
                                iVar133 = iVar133 + (uint)((iVar123 - 5U & 0xfffffffd) == 0 &&
                                                          (uVar132 == 0 && uVar145 == 0));
                                iVar125 = iVar125 + (uint)((iVar123 == 6 && uVar145 == 0) &&
                                                          (uVar1 & 0xfffffffd) == 0);
                                iVar88 = iVar88 + (uint)((iVar123 == 6 && uVar132 == 0) &&
                                                        (uVar93 & 0xfffffffd) == 0);
                              }
                              iVar123 = iVar123 + 1;
                            } while (iVar123 != 8);
                            iVar175 = iVar175 + 3;
                            uVar132 = uVar1;
                          } while (uVar1 != 2);
                          iVar89 = iVar89 + 9;
                          uVar145 = uVar93;
                        } while (uVar93 != 2);
                        dVar201 = 2.0;
                        if ((uVar29 >> 0x15 & 1) != 0) {
                          lVar91 = -1;
                          cVar144 = '\b';
                          dVar201 = dVar213;
                          dVar203 = dVar213;
                          do {
                            iVar89 = 0;
                            bVar184 = true;
                            do {
                              bVar173 = bVar184;
                              lVar121 = 0;
                              dVar207 = dVar201;
                              do {
                                dVar201 = dVar207;
                                if (((int)lVar121 != 1 || (iVar89 != 0 || (int)lVar91 != 0)) &&
                                   ((1 << ((char)iVar89 * '\x03' + cVar144 + (char)lVar121 & 0x1fU)
                                    & uVar29) != 0)) {
                                  dVar210 = pdVar32[lVar96 + (iVar105 + (int)lVar91) * lVar34 +
                                                             (iVar131 + iVar89) * lVar33 +
                                                             (long)(iVar129 + (int)lVar121)];
                                  dVar201 = dVar210;
                                  if (dVar210 <= dVar207) {
                                    dVar201 = dVar207;
                                  }
                                  if (dVar210 < dVar203) {
                                    dVar203 = dVar210;
                                  }
                                }
                                lVar121 = lVar121 + 1;
                                dVar207 = dVar201;
                              } while (lVar121 != 3);
                              iVar89 = 1;
                              bVar184 = false;
                            } while (bVar173);
                            lVar91 = lVar91 + 1;
                            cVar144 = cVar144 + '\t';
                          } while (lVar91 != 2);
                          dVar207 = (((pdVar42 + lVar106 + (iVar124 - iVar10) * lVar43 + lVar103)
                                      [lVar45] - dVar200) * dVar204 +
                                    (0.5 - dVar209) * dVar199 +
                                    (pdVar42[lVar106 + (iVar124 - iVar10) * lVar43 + lVar103] -
                                    dVar215) * dVar195 + dVar213) - dVar213;
                          if (dVar207 <= 1e-13) {
                            dVar201 = 1.0;
                            if ((dVar207 < -1e-13) &&
                               (dVar201 = (dVar203 - dVar213) / dVar207, 1.0 <= dVar201)) {
                              dVar201 = dVar214;
                            }
                          }
                          else {
                            dVar201 = (dVar201 - dVar213) / dVar207;
                            if (1.0 <= dVar201) {
                              dVar201 = dVar214;
                            }
                          }
                          if (2.0 <= dVar201) {
                            dVar201 = 2.0;
                          }
                        }
                        lVar91 = -1;
                        cVar144 = '\x05';
                        dVar207 = dVar213;
                        dVar203 = dVar213;
                        do {
                          lVar103 = -1;
                          cVar180 = cVar144;
                          do {
                            lVar121 = 0;
                            dVar210 = dVar203;
                            do {
                              dVar203 = dVar210;
                              if (((int)lVar121 != 1 || ((int)lVar103 != 0 || (int)lVar91 != 0)) &&
                                 ((1 << (cVar180 + (char)lVar121 & 0x1fU) & uVar29) != 0)) {
                                dVar212 = pdVar32[lVar96 + (iVar105 + (int)lVar91) * lVar34 +
                                                           (iVar131 + (int)lVar103) * lVar33 +
                                                           (long)(iVar129 + (int)lVar121)];
                                dVar203 = dVar212;
                                if (dVar212 <= dVar210) {
                                  dVar203 = dVar210;
                                }
                                if (dVar212 < dVar207) {
                                  dVar207 = dVar212;
                                }
                              }
                              lVar121 = lVar121 + 1;
                              dVar210 = dVar203;
                            } while (lVar121 != 3);
                            cVar180 = cVar180 + '\x03';
                            bVar184 = lVar103 != 0;
                            lVar103 = lVar103 + 1;
                          } while (bVar184);
                          lVar91 = lVar91 + 1;
                          cVar144 = cVar144 + '\t';
                        } while (lVar91 != 2);
                        dVar210 = (dVar205 * dVar204 +
                                  ((dVar192 * dVar195 + dVar213) - (dVar209 + 0.5) * dVar199)) -
                                  dVar213;
                        if (dVar210 <= 1e-13) {
                          dVar203 = 1.0;
                          if ((dVar210 < -1e-13) &&
                             (dVar203 = (dVar207 - dVar213) / dVar210, 1.0 <= dVar203)) {
                            dVar203 = 1.0;
                          }
                        }
                        else {
                          dVar203 = (dVar203 - dVar213) / dVar210;
                          if (1.0 <= dVar203) {
                            dVar203 = 1.0;
                          }
                        }
                        if (dVar201 <= dVar203) {
                          dVar203 = dVar201;
                        }
                        dVar201 = dVar203;
                        if ((uVar29 >> 0x13 & 1) != 0) {
                          lVar91 = -1;
                          dVar201 = dVar213;
                          dVar207 = dVar213;
                          do {
                            lVar103 = -1;
                            do {
                              iVar89 = 0;
                              dVar210 = dVar201;
                              bVar184 = true;
                              do {
                                bVar173 = bVar184;
                                dVar201 = dVar210;
                                if ((((int)lVar103 != 0 || (int)lVar91 != 0) || iVar89 != 0) &&
                                   ((1 << ((char)lVar103 * '\x03' + (char)lVar91 * '\t' + '\x12' +
                                           (char)iVar89 & 0x1fU) & uVar29) != 0)) {
                                  dVar212 = pdVar32[lVar96 + (iVar105 + (int)lVar91) * lVar34 +
                                                             (iVar131 + (int)lVar103) * lVar33 +
                                                             (long)(iVar89 + (iVar87 - iVar165))];
                                  dVar201 = dVar212;
                                  if (dVar212 <= dVar210) {
                                    dVar201 = dVar210;
                                  }
                                  if (dVar212 < dVar207) {
                                    dVar207 = dVar212;
                                  }
                                }
                                iVar89 = 1;
                                dVar210 = dVar201;
                                bVar184 = false;
                              } while (bVar173);
                              lVar103 = lVar103 + 1;
                            } while (lVar103 != 2);
                            lVar91 = lVar91 + 1;
                          } while (lVar91 != 2);
                          dVar210 = (((pdVar46 + lVar112 + lVar138 + ((iVar87 - iVar12) + 1))
                                      [lVar49] - dVar200) * dVar204 +
                                    (pdVar46[lVar112 + lVar138 + ((iVar87 - iVar12) + 1)] - dVar209)
                                    * dVar199 + (0.5 - dVar215) * dVar195 + dVar213) - dVar213;
                          if (dVar210 <= 1e-13) {
                            dVar201 = dVar214;
                            if ((dVar210 < -1e-13) &&
                               (dVar201 = (dVar207 - dVar213) / dVar210, 1.0 <= dVar201)) {
                              dVar201 = 1.0;
                            }
                          }
                          else {
                            dVar201 = (dVar201 - dVar213) / dVar210;
                            if (1.0 <= dVar201) {
                              dVar201 = dVar214;
                            }
                          }
                          if (dVar203 <= dVar201) {
                            dVar201 = dVar203;
                          }
                        }
                        dVar214 = dVar201;
                        if ((uVar29 >> 0x11 & 1) != 0) {
                          lVar91 = -1;
                          cVar144 = '\x05';
                          dVar214 = dVar213;
                          dVar203 = dVar213;
                          do {
                            lVar103 = -1;
                            cVar180 = cVar144;
                            do {
                              lVar121 = 0;
                              do {
                                if (((int)lVar121 != 1 || ((int)lVar103 != 0 || (int)lVar91 != 0))
                                   && ((1 << (cVar180 + (char)lVar121 & 0x1fU) & uVar29) != 0)) {
                                  dVar207 = pdVar32[lVar96 + (iVar105 + (int)lVar91) * lVar34 +
                                                             (iVar131 + (int)lVar103) * lVar33 +
                                                             (long)(iVar129 + (int)lVar121)];
                                  dVar210 = dVar207;
                                  if (dVar207 <= dVar214) {
                                    dVar210 = dVar214;
                                  }
                                  dVar214 = dVar210;
                                  if (dVar207 < dVar203) {
                                    dVar203 = dVar207;
                                  }
                                }
                                lVar121 = lVar121 + 1;
                              } while (lVar121 != 2);
                              lVar103 = lVar103 + 1;
                              cVar180 = cVar180 + '\x03';
                            } while (lVar103 != 2);
                            lVar91 = lVar91 + 1;
                            cVar144 = cVar144 + '\t';
                          } while (lVar91 != 2);
                          dVar207 = (((pdVar46 + lVar112 + lVar138 + (lVar90 - iVar12))[lVar49] -
                                     dVar200) * dVar204 +
                                    (pdVar46[lVar112 + lVar138 + (lVar90 - iVar12)] - dVar209) *
                                    dVar199 + (dVar213 - (dVar215 + 0.5) * dVar195)) - dVar213;
                          if (dVar207 <= 1e-13) {
                            dVar214 = 1.0;
                            if ((dVar207 < -1e-13) &&
                               (dVar214 = (dVar203 - dVar213) / dVar207, 1.0 <= dVar214)) {
                              dVar214 = 1.0;
                            }
                          }
                          else {
                            dVar214 = (dVar214 - dVar213) / dVar207;
                            if (1.0 <= dVar214) {
                              dVar214 = 1.0;
                            }
                          }
                          if (dVar201 <= dVar214) {
                            dVar214 = dVar201;
                          }
                        }
                        dVar203 = 1.0;
                        dVar201 = dVar214;
                        if ((uVar29 >> 0x1b & 1) != 0) {
                          iVar89 = 0;
                          dVar201 = dVar213;
                          dVar207 = dVar213;
                          bVar184 = true;
                          do {
                            bVar173 = bVar184;
                            iVar175 = iVar89 * 9 + 0xe;
                            lVar91 = -1;
                            do {
                              lVar103 = 0;
                              dVar210 = dVar201;
                              do {
                                dVar201 = dVar210;
                                if (((int)lVar103 != 1 || ((int)lVar91 != 0 || iVar89 != 0)) &&
                                   ((1 << ((char)iVar175 + (char)lVar103 & 0x1fU) & uVar29) != 0)) {
                                  dVar212 = pdVar32[lVar96 + (iVar105 + iVar89) * lVar34 +
                                                             (iVar131 + (int)lVar91) * lVar33 +
                                                             (long)(iVar129 + (int)lVar103)];
                                  dVar201 = dVar212;
                                  if (dVar212 <= dVar210) {
                                    dVar201 = dVar210;
                                  }
                                  if (dVar212 < dVar207) {
                                    dVar207 = dVar212;
                                  }
                                }
                                lVar103 = lVar103 + 1;
                                dVar210 = dVar201;
                              } while (lVar103 != 3);
                              lVar91 = lVar91 + 1;
                              iVar175 = iVar175 + 3;
                            } while (lVar91 != 2);
                            iVar89 = 1;
                            bVar184 = false;
                          } while (bVar173);
                          dVar210 = ((0.5 - dVar200) * dVar204 +
                                    ((pdVar38 + lVar139 + lVar153 + (lVar90 - lVar167))[lVar41] -
                                    dVar209) * dVar199 +
                                    (pdVar38[lVar139 + lVar153 + (lVar90 - lVar167)] - dVar215) *
                                    dVar195 + dVar213) - dVar213;
                          if (dVar210 <= 1e-13) {
                            dVar201 = dVar203;
                            if ((dVar210 < -1e-13) &&
                               (dVar201 = (dVar207 - dVar213) / dVar210, 1.0 <= dVar201)) {
                              dVar201 = 1.0;
                            }
                          }
                          else {
                            dVar201 = (dVar201 - dVar213) / dVar210;
                            if (1.0 <= dVar201) {
                              dVar201 = dVar203;
                            }
                          }
                          if (dVar214 <= dVar201) {
                            dVar201 = dVar214;
                          }
                        }
                        dVar214 = dVar201;
                        if ((uVar29 >> 9 & 1) != 0) {
                          cVar144 = '\x05';
                          lVar91 = -1;
                          dVar207 = dVar213;
                          dVar214 = dVar213;
                          do {
                            lVar103 = -1;
                            cVar180 = cVar144;
                            do {
                              lVar121 = 0;
                              do {
                                if (((int)lVar121 != 1 || ((int)lVar103 != 0 || (int)lVar91 != 0))
                                   && ((1 << (cVar180 + (char)lVar121 & 0x1fU) & uVar29) != 0)) {
                                  dVar210 = pdVar32[lVar96 + (iVar105 + (int)lVar91) * lVar34 +
                                                             (iVar131 + (int)lVar103) * lVar33 +
                                                             (long)(iVar129 + (int)lVar121)];
                                  dVar212 = dVar210;
                                  if (dVar210 <= dVar214) {
                                    dVar212 = dVar214;
                                  }
                                  dVar214 = dVar212;
                                  if (dVar210 < dVar207) {
                                    dVar207 = dVar210;
                                  }
                                }
                                lVar121 = lVar121 + 1;
                              } while (lVar121 != 3);
                              lVar103 = lVar103 + 1;
                              cVar180 = cVar180 + '\x03';
                            } while (lVar103 != 2);
                            cVar144 = cVar144 + '\t';
                            bVar184 = lVar91 != 0;
                            lVar91 = lVar91 + 1;
                          } while (bVar184);
                          dVar215 = ((((pdVar38 + lVar139 + lVar154 + (lVar90 - lVar167))[lVar41] -
                                      dVar209) * dVar199 +
                                     (pdVar38[lVar139 + lVar154 + (lVar90 - lVar167)] - dVar215) *
                                     dVar195 + dVar213) - (dVar200 + 0.5) * dVar204) - dVar213;
                          if (dVar215 <= 1e-13) {
                            dVar214 = dVar203;
                            if ((dVar215 < -1e-13) &&
                               (dVar214 = (dVar207 - dVar213) / dVar215, 1.0 <= dVar214)) {
                              dVar214 = 1.0;
                            }
                          }
                          else {
                            dVar214 = (dVar214 - dVar213) / dVar215;
                            if (1.0 <= dVar214) {
                              dVar214 = 1.0;
                            }
                          }
                          if (dVar201 <= dVar214) {
                            dVar214 = dVar201;
                          }
                        }
                        dVar215 = 0.0;
                        if (1 < iVar133) {
                          dVar215 = dVar214;
                        }
                        dVar200 = 0.0;
                        if (1 < iVar125) {
                          dVar200 = dVar214;
                        }
                        dVar201 = 0.0;
                        if (1 < iVar88) {
                          dVar201 = dVar214;
                        }
                        if ((dVar211 != 1.0) || (NAN(dVar211))) {
                          local_8e8 = pdVar50[lVar115 + lVar128 + lVar142];
                        }
                        else {
                          if ((((pdVar50[lVar101 + lVar128 + (int)(~uVar15 + iVar87)] == 1.0) &&
                               (!NAN(pdVar50[lVar101 + lVar128 + (int)(~uVar15 + iVar87)]))) &&
                              (pdVar50[lVar101 + lVar128 + (int)((iVar87 - uVar15) + 1)] == 1.0)) &&
                             (!NAN(pdVar50[lVar101 + lVar128 + (int)((iVar87 - uVar15) + 1)]))) {
                            dVar215 = dVar203;
                          }
                          local_8e8 = pdVar50[lVar115 + lVar128 + lVar142];
                          if (((local_8e8 == 1.0) && (!NAN(local_8e8))) &&
                             ((pdVar50[lVar128 + lVar140 + lVar142] == 1.0 &&
                              (!NAN(pdVar50[lVar128 + lVar140 + lVar142]))))) {
                            dVar200 = 1.0;
                          }
                          if (((pdVar50[lVar101 + lVar142 + lVar113] == 1.0) &&
                              (!NAN(pdVar50[lVar101 + lVar142 + lVar113]))) &&
                             ((pdVar50[lVar101 + lVar142 + lVar114] == 1.0 &&
                              (!NAN(pdVar50[lVar101 + lVar142 + lVar114]))))) {
                            dVar201 = dVar203;
                          }
                        }
                        dVar214 = dVar205 * dVar204 * dVar201 +
                                  dVar192 * dVar195 * dVar215 +
                                  -(dVar209 + 0.5) * dVar199 * dVar200 + dVar213;
                        if (dVar214 <= dVar193) {
                          dVar193 = dVar214;
                        }
                        if (dVar187 <= dVar193) {
                          dVar187 = dVar193;
                        }
                        dVar187 = pdVar64[lVar157 + lVar147 + (lVar90 - lVar146)] * dVar186 * -0.5 *
                                  dVar199 * dVar200 + dVar187;
                        local_988 = pdVar50 + lVar115 + lVar142;
                        if ((local_8e8 == 1.0) && (!NAN(local_8e8))) goto LAB_0042de11;
                        bVar184 = false;
LAB_0042e1ac:
                        lVar91 = lVar90 - lVar168;
                        dVar192 = pdVar42[lVar106 + lVar135 + lVar91];
                        dVar205 = (pdVar42 + lVar106 + lVar135 + lVar91)[lVar45];
                        pdVar151 = pdVar31 + (iVar84 - iVar5) * lVar37 +
                                             iVar85 * lVar36 + (long)(iVar87 - iVar181);
                        dVar209 = pdVar151[lVar30];
                        dVar215 = *pdVar151;
                        dVar200 = pdVar151[lVar30 * 2];
                        lVar103 = (long)(iVar87 - iVar165);
                        dVar213 = pdVar32[lVar118 + lVar108 + lVar96 + lVar103];
                        dVar193 = pdVar32[lVar119 + lVar103 + lVar108 + lVar96];
                        uVar29 = pEVar53[lVar98 + (lVar2 - lVar177) * lVar54 + lVar102].flag;
                        lVar102 = -1;
                        cVar144 = '\x05';
                        lVar121 = 0;
                        do {
                          iVar133 = (int)lVar102;
                          lVar143 = -1;
                          cVar180 = cVar144;
                          do {
                            iVar88 = (int)lVar143;
                            iVar89 = (int)lVar121;
                            ppdVar122 = &local_3b8.q.p + (long)iVar89 * 3;
                            lVar121 = 0;
                            do {
                              iVar125 = (int)lVar121 + -1;
                              if (((iVar88 == 0 && iVar133 == 0) && iVar125 == 0) ||
                                 ((1 << (cVar180 + (char)lVar121 & 0x1fU) & uVar29) == 0)) {
                                *ppdVar122 = (double *)0x0;
                                ppdVar122[1] = (double *)0x0;
                                ppdVar122[2] = (double *)0x0;
                              }
                              else {
                                pdVar151 = pdVar31 + ((iVar84 - iVar5) + iVar133) * lVar37 +
                                                     (iVar85 + iVar88) * lVar36 +
                                                     (long)(iVar80 + (int)lVar121);
                                dVar214 = pdVar151[lVar30];
                                *ppdVar122 = (double *)((*pdVar151 + (double)iVar125) - dVar215);
                                ppdVar122[1] = (double *)((dVar214 + (double)iVar88) - dVar209);
                                ppdVar122[2] = (double *)
                                               ((pdVar151[lVar30 * 2] + (double)iVar133) - dVar200);
                              }
                              lVar121 = lVar121 + 1;
                              ppdVar122 = ppdVar122 + 3;
                            } while (lVar121 != 3);
                            lVar143 = lVar143 + 1;
                            cVar180 = cVar180 + '\x03';
                            lVar121 = (long)iVar89 + 3;
                          } while (lVar143 != 2);
                          lVar102 = lVar102 + 1;
                          cVar144 = cVar144 + '\t';
                          lVar121 = (long)iVar89 + 3;
                        } while (lVar102 != 2);
                        lVar121 = -1;
                        cVar144 = '\x05';
                        lVar102 = 0;
                        do {
                          lVar143 = -1;
                          cVar180 = cVar144;
                          do {
                            iVar133 = (int)lVar102;
                            lVar102 = 0;
                            do {
                              dVar214 = 0.0;
                              if (((int)lVar102 != 1 || ((int)lVar143 != 0 || (int)lVar121 != 0)) &&
                                 ((1 << (cVar180 + (char)lVar102 & 0x1fU) & uVar29) != 0)) {
                                dVar214 = pdVar32[lVar96 + (iVar105 + (int)lVar121) * lVar34 +
                                                           (iVar86 + (int)lVar143) * lVar33 +
                                                           (long)(iVar129 + (int)lVar102)] - dVar193
                                ;
                              }
                              adStack_108[iVar133 + lVar102] = dVar214;
                              lVar102 = lVar102 + 1;
                            } while (lVar102 != 3);
                            lVar143 = lVar143 + 1;
                            cVar180 = cVar180 + '\x03';
                            lVar102 = (long)iVar133 + 3;
                          } while (lVar143 != 2);
                          lVar121 = lVar121 + 1;
                          cVar144 = cVar144 + '\t';
                          lVar102 = (long)iVar133 + 3;
                        } while (lVar121 != 2);
                        dVar205 = dVar205 - dVar200;
                        dVar203 = 0.0;
                        dVar204 = 0.0;
                        dVar212 = 0.0;
                        pLVar104 = &local_3b8.q.kstride;
                        lVar102 = 0;
                        dVar214 = 0.0;
                        dVar195 = 0.0;
                        dVar207 = 0.0;
                        dVar210 = 0.0;
                        dVar199 = 0.0;
                        dVar201 = 0.0;
                        do {
                          pdVar151 = ((Array4<const_double> *)(pLVar104 + -2))->p;
                          dVar206 = (double)pLVar104[-1];
                          dVar188 = (double)*pLVar104;
                          dVar202 = adStack_108[lVar102];
                          dVar199 = dVar199 + (double)pdVar151 * dVar188;
                          dVar201 = dVar201 + dVar206 * dVar206;
                          dVar212 = dVar212 + dVar188 * dVar188;
                          dVar207 = dVar207 + (double)pdVar151 * (double)pdVar151;
                          dVar210 = dVar210 + dVar202 * (double)pdVar151;
                          dVar203 = dVar203 + dVar206 * (double)pdVar151;
                          dVar204 = dVar204 + dVar202 * dVar206;
                          dVar214 = dVar214 + dVar202 * dVar188;
                          dVar195 = dVar195 + dVar188 * dVar206;
                          lVar102 = lVar102 + 1;
                          pLVar104 = pLVar104 + 3;
                        } while (lVar102 != 0x1b);
                        dVar208 = dVar203 * dVar212 - dVar199 * dVar195;
                        dVar188 = dVar203 * dVar195 + -dVar201 * dVar199;
                        dVar202 = dVar212 * dVar204 - dVar214 * dVar195;
                        dVar206 = dVar212 * dVar201 - dVar195 * dVar195;
                        dVar212 = dVar203 * dVar214 - dVar199 * dVar204;
                        auVar189._0_8_ = dVar199 * dVar212 + (dVar207 * dVar202 - dVar208 * dVar210)
                        ;
                        auVar189._8_8_ =
                             dVar199 * (dVar204 * dVar195 - dVar214 * dVar201) +
                             (dVar210 * dVar206 - dVar202 * dVar203);
                        dVar199 = dVar188 * dVar199 + (dVar206 * dVar207 - dVar203 * dVar208);
                        auVar194._8_8_ = dVar199;
                        auVar194._0_8_ = dVar199;
                        auVar190 = divpd(auVar189,auVar194);
                        uVar185 = auVar190._0_8_;
                        dVar199 = (dVar188 * dVar210 +
                                  ((dVar201 * dVar214 + -dVar204 * dVar195) * dVar207 -
                                  dVar203 * dVar212)) / dVar199;
                        if (bVar184) {
                          uVar191 = auVar190._8_8_;
                          if ((pdVar50[lVar115 + lVar128 + ((lVar90 + -1) - lVar127)] == 1.0) &&
                             (!NAN(pdVar50[lVar115 + lVar128 + ((lVar90 + -1) - lVar127)]))) {
                            if ((pdVar50[lVar115 + lVar128 + ((lVar90 + 1) - lVar127)] == 1.0) &&
                               (!NAN(pdVar50[lVar115 + lVar128 + ((lVar90 + 1) - lVar127)]))) {
                              dVar201 = dVar193 - pdVar32[lVar119 + lVar108 + lVar96 + ((lVar90 + -1
                                                                                        ) - lVar95)]
                              ;
                              dVar203 = pdVar32[lVar119 + lVar108 + lVar96 + ((lVar90 + 1) - lVar95)
                                               ] - dVar193;
                              dVar201 = dVar201 + dVar201;
                              dVar203 = dVar203 + dVar203;
                              dVar214 = (pdVar32[lVar119 + lVar108 + lVar96 + ((lVar90 + 1) - lVar95
                                                                              )] -
                                        pdVar32[lVar119 + lVar108 + lVar96 + ((lVar90 + -1) - lVar95
                                                                             )]) * 0.5;
                              dVar204 = ABS(dVar201);
                              uVar191 = -(ulong)(0.0 < dVar214);
                              dVar214 = ABS(dVar214);
                              dVar195 = ABS(dVar203);
                              if (dVar204 <= dVar214) {
                                dVar214 = dVar204;
                              }
                              if (dVar214 <= dVar195) {
                                dVar195 = dVar214;
                              }
                              uVar196 = -(ulong)(0.0 < dVar201 * dVar203) & (ulong)dVar195;
                              uVar191 = ~uVar191 & (uVar196 ^ 0x8000000000000000) |
                                        uVar191 & uVar196;
                            }
                          }
                          if ((((dVar211 == 1.0) && (!NAN(dVar211))) &&
                              (pdVar50[lVar128 + lVar116 + lVar142] == 1.0)) &&
                             (!NAN(pdVar50[lVar128 + lVar116 + lVar142]))) {
                            dVar203 = dVar193 - pdVar32[lVar164 + lVar108 + lVar96 + lVar103];
                            dVar201 = (dVar213 - dVar193) + (dVar213 - dVar193);
                            dVar203 = dVar203 + dVar203;
                            dVar214 = (dVar213 - pdVar32[lVar164 + lVar108 + lVar96 + lVar103]) *
                                      0.5;
                            dVar204 = ABS(dVar203);
                            uVar185 = -(ulong)(0.0 < dVar214);
                            dVar214 = ABS(dVar214);
                            dVar195 = ABS(dVar201);
                            if (dVar204 <= dVar214) {
                              dVar214 = dVar204;
                            }
                            if (dVar214 <= dVar195) {
                              dVar195 = dVar214;
                            }
                            uVar196 = -(ulong)(0.0 < dVar203 * dVar201) & (ulong)dVar195;
                            uVar185 = ~uVar185 & (uVar196 ^ 0x8000000000000000) | uVar185 & uVar196;
                          }
                          auVar190._8_8_ = uVar191;
                          auVar190._0_8_ = uVar185;
                          if (((local_988[lVar109] == 1.0) && (!NAN(local_988[lVar109]))) &&
                             ((local_988[lVar110] == 1.0 && (!NAN(local_988[lVar110]))))) {
                            dVar201 = dVar193 - pdVar32[lVar119 + lVar103 + lVar178 + lVar96];
                            dVar203 = pdVar32[lVar119 + lVar103 + lVar111 + lVar96] - dVar193;
                            dVar201 = dVar201 + dVar201;
                            dVar203 = dVar203 + dVar203;
                            dVar195 = (pdVar32[lVar119 + lVar103 + lVar111 + lVar96] -
                                      pdVar32[lVar119 + lVar103 + lVar178 + lVar96]) * 0.5;
                            dVar199 = ABS(dVar201);
                            uVar185 = -(ulong)(0.0 < dVar195);
                            dVar195 = ABS(dVar195);
                            dVar214 = ABS(dVar203);
                            if (dVar199 <= dVar195) {
                              dVar195 = dVar199;
                            }
                            if (dVar195 <= dVar214) {
                              dVar214 = dVar195;
                            }
                            uVar191 = -(ulong)(0.0 < dVar201 * dVar203) & (ulong)dVar214;
                            dVar199 = (double)(~uVar185 & (uVar191 ^ 0x8000000000000000) |
                                              uVar185 & uVar191);
                          }
                        }
                        dVar214 = dVar193;
                        if (dVar213 <= dVar193) {
                          dVar214 = dVar213;
                        }
                        dVar195 = dVar193;
                        if (dVar193 <= dVar213) {
                          dVar195 = dVar213;
                        }
                        dVar192 = dVar192 - dVar215;
                        iVar89 = 0;
                        iVar133 = 0;
                        iVar88 = 0;
                        iVar125 = 0;
                        uVar145 = 0xffffffff;
                        do {
                          uVar93 = uVar145 + 1;
                          uVar132 = 0xffffffff;
                          iVar175 = iVar89;
                          do {
                            uVar1 = uVar132 + 1;
                            iVar123 = 5;
                            do {
                              if (((uVar29 >> (iVar123 + iVar175 & 0x1fU) & 1) != 0) &&
                                 ((iVar123 != 6 || uVar132 != 0) || uVar145 != 0)) {
                                iVar133 = iVar133 + (uint)((iVar123 - 5U & 0xfffffffd) == 0 &&
                                                          (uVar132 == 0 && uVar145 == 0));
                                iVar88 = iVar88 + (uint)((iVar123 == 6 && uVar145 == 0) &&
                                                        (uVar1 & 0xfffffffd) == 0);
                                iVar125 = iVar125 + (uint)((iVar123 == 6 && uVar132 == 0) &&
                                                          (uVar93 & 0xfffffffd) == 0);
                              }
                              iVar123 = iVar123 + 1;
                            } while (iVar123 != 8);
                            iVar175 = iVar175 + 3;
                            uVar132 = uVar1;
                          } while (uVar1 != 2);
                          iVar89 = iVar89 + 9;
                          uVar145 = uVar93;
                        } while (uVar93 != 2);
                        dVar203 = auVar190._8_8_;
                        dVar213 = 2.0;
                        dVar201 = auVar190._0_8_;
                        if ((uVar29 >> 0x15 & 1) != 0) {
                          lVar102 = -1;
                          cVar144 = '\b';
                          dVar204 = dVar193;
                          dVar213 = dVar193;
                          do {
                            iVar89 = 0;
                            bVar184 = true;
                            do {
                              bVar173 = bVar184;
                              lVar103 = 0;
                              do {
                                if (((int)lVar103 != 1 || (iVar89 != 0 || (int)lVar102 != 0)) &&
                                   ((1 << ((char)iVar89 * '\x03' + cVar144 + (char)lVar103 & 0x1fU)
                                    & uVar29) != 0)) {
                                  dVar207 = pdVar32[lVar96 + (iVar105 + (int)lVar102) * lVar34 +
                                                             (iVar86 + iVar89) * lVar33 +
                                                             (long)(iVar129 + (int)lVar103)];
                                  dVar210 = dVar207;
                                  if (dVar207 <= dVar213) {
                                    dVar210 = dVar213;
                                  }
                                  dVar213 = dVar210;
                                  if (dVar207 < dVar204) {
                                    dVar204 = dVar207;
                                  }
                                }
                                lVar103 = lVar103 + 1;
                              } while (lVar103 != 3);
                              iVar89 = 1;
                              bVar184 = false;
                            } while (bVar173);
                            lVar102 = lVar102 + 1;
                            cVar144 = cVar144 + '\t';
                          } while (lVar102 != 2);
                          dVar207 = (dVar205 * dVar199 +
                                    (0.5 - dVar209) * dVar201 + dVar192 * dVar203 + dVar193) -
                                    dVar193;
                          if (dVar207 <= 1e-13) {
                            dVar213 = 1.0;
                            if ((dVar207 < -1e-13) &&
                               (dVar213 = (dVar204 - dVar193) / dVar207, 1.0 <= dVar213)) {
                              dVar213 = 1.0;
                            }
                          }
                          else {
                            dVar213 = (dVar213 - dVar193) / dVar207;
                            if (1.0 <= dVar213) {
                              dVar213 = 1.0;
                            }
                          }
                          if (2.0 <= dVar213) {
                            dVar213 = 2.0;
                          }
                        }
                        dVar204 = dVar213;
                        if ((short)uVar29 < 0) {
                          lVar102 = -1;
                          cVar144 = '\x05';
                          dVar207 = dVar193;
                          dVar204 = dVar193;
                          do {
                            lVar103 = -1;
                            cVar180 = cVar144;
                            do {
                              lVar121 = 0;
                              do {
                                if (((int)lVar121 != 1 || ((int)lVar103 != 0 || (int)lVar102 != 0))
                                   && ((1 << (cVar180 + (char)lVar121 & 0x1fU) & uVar29) != 0)) {
                                  dVar210 = pdVar32[lVar96 + (iVar105 + (int)lVar102) * lVar34 +
                                                             (iVar86 + (int)lVar103) * lVar33 +
                                                             (long)(iVar129 + (int)lVar121)];
                                  dVar212 = dVar210;
                                  if (dVar210 <= dVar204) {
                                    dVar212 = dVar204;
                                  }
                                  dVar204 = dVar212;
                                  if (dVar210 < dVar207) {
                                    dVar207 = dVar210;
                                  }
                                }
                                lVar121 = lVar121 + 1;
                              } while (lVar121 != 3);
                              cVar180 = cVar180 + '\x03';
                              bVar184 = lVar103 != 0;
                              lVar103 = lVar103 + 1;
                            } while (bVar184);
                            lVar102 = lVar102 + 1;
                            cVar144 = cVar144 + '\t';
                          } while (lVar102 != 2);
                          dVar210 = (((pdVar42 + lVar106 + (lVar2 - iVar10) * lVar43 + lVar91)
                                      [lVar45] - dVar200) * dVar199 +
                                    (((pdVar42[lVar106 + (lVar2 - iVar10) * lVar43 + lVar91] -
                                      dVar215) * dVar203 + dVar193) - (dVar209 + 0.5) * dVar201)) -
                                    dVar193;
                          if (dVar210 <= 1e-13) {
                            dVar204 = 1.0;
                            if ((dVar210 < -1e-13) &&
                               (dVar204 = (dVar207 - dVar193) / dVar210, 1.0 <= dVar204)) {
                              dVar204 = 1.0;
                            }
                          }
                          else {
                            dVar204 = (dVar204 - dVar193) / dVar210;
                            if (1.0 <= dVar204) {
                              dVar204 = 1.0;
                            }
                          }
                          if (dVar213 <= dVar204) {
                            dVar204 = dVar213;
                          }
                        }
                        dVar213 = dVar204;
                        if ((uVar29 >> 0x13 & 1) != 0) {
                          lVar102 = -1;
                          dVar213 = dVar193;
                          dVar207 = dVar193;
                          do {
                            lVar91 = -1;
                            do {
                              iVar89 = 0;
                              dVar210 = dVar213;
                              bVar184 = true;
                              do {
                                bVar173 = bVar184;
                                dVar213 = dVar210;
                                if ((((int)lVar91 != 0 || (int)lVar102 != 0) || iVar89 != 0) &&
                                   ((1 << ((char)lVar91 * '\x03' + (char)lVar102 * '\t' + '\x12' +
                                           (char)iVar89 & 0x1fU) & uVar29) != 0)) {
                                  dVar212 = pdVar32[lVar96 + (iVar105 + (int)lVar102) * lVar34 +
                                                             (iVar86 + (int)lVar91) * lVar33 +
                                                             (long)(iVar89 + (iVar87 - iVar165))];
                                  dVar213 = dVar212;
                                  if (dVar212 <= dVar210) {
                                    dVar213 = dVar210;
                                  }
                                  if (dVar212 < dVar207) {
                                    dVar207 = dVar212;
                                  }
                                }
                                iVar89 = 1;
                                dVar210 = dVar213;
                                bVar184 = false;
                              } while (bVar173);
                              lVar91 = lVar91 + 1;
                            } while (lVar91 != 2);
                            lVar102 = lVar102 + 1;
                          } while (lVar102 != 2);
                          dVar210 = (((pdVar46 + lVar112 + lVar120 + ((iVar87 - iVar12) + 1))
                                      [lVar49] - dVar200) * dVar199 +
                                    (pdVar46[lVar112 + lVar120 + ((iVar87 - iVar12) + 1)] - dVar209)
                                    * dVar201 + (0.5 - dVar215) * dVar203 + dVar193) - dVar193;
                          if (dVar210 <= 1e-13) {
                            dVar213 = 1.0;
                            if (dVar210 < -1e-13) {
                              dVar213 = (dVar207 - dVar193) / dVar210;
                              if (1.0 <= dVar213) {
                                dVar213 = 1.0;
                              }
                            }
                          }
                          else {
                            dVar213 = (dVar213 - dVar193) / dVar210;
                            if (1.0 <= dVar213) {
                              dVar213 = 1.0;
                            }
                          }
                          if (dVar204 <= dVar213) {
                            dVar213 = dVar204;
                          }
                        }
                        dVar204 = dVar213;
                        if ((uVar29 >> 0x11 & 1) != 0) {
                          lVar102 = -1;
                          cVar144 = '\x05';
                          dVar204 = dVar193;
                          dVar207 = dVar193;
                          do {
                            lVar91 = -1;
                            cVar180 = cVar144;
                            do {
                              lVar103 = 0;
                              dVar210 = dVar204;
                              do {
                                dVar204 = dVar210;
                                if (((int)lVar103 != 1 || ((int)lVar91 != 0 || (int)lVar102 != 0))
                                   && ((1 << (cVar180 + (char)lVar103 & 0x1fU) & uVar29) != 0)) {
                                  dVar212 = pdVar32[lVar96 + (iVar105 + (int)lVar102) * lVar34 +
                                                             (iVar86 + (int)lVar91) * lVar33 +
                                                             (long)(iVar129 + (int)lVar103)];
                                  dVar204 = dVar212;
                                  if (dVar212 <= dVar210) {
                                    dVar204 = dVar210;
                                  }
                                  if (dVar212 < dVar207) {
                                    dVar207 = dVar212;
                                  }
                                }
                                lVar103 = lVar103 + 1;
                                dVar210 = dVar204;
                              } while (lVar103 != 2);
                              lVar91 = lVar91 + 1;
                              cVar180 = cVar180 + '\x03';
                            } while (lVar91 != 2);
                            lVar102 = lVar102 + 1;
                            cVar144 = cVar144 + '\t';
                          } while (lVar102 != 2);
                          dVar210 = (((pdVar46 + lVar112 + lVar120 + (lVar90 - iVar12))[lVar49] -
                                     dVar200) * dVar199 +
                                    (pdVar46[lVar112 + lVar120 + (lVar90 - iVar12)] - dVar209) *
                                    dVar201 + (dVar193 - (dVar215 + 0.5) * dVar203)) - dVar193;
                          if (dVar210 <= 1e-13) {
                            dVar204 = 1.0;
                            if (dVar210 < -1e-13) {
                              dVar204 = (dVar207 - dVar193) / dVar210;
                              if (1.0 <= dVar204) {
                                dVar204 = 1.0;
                              }
                            }
                          }
                          else {
                            dVar204 = (dVar204 - dVar193) / dVar210;
                            if (1.0 <= dVar204) {
                              dVar204 = 1.0;
                            }
                          }
                          if (dVar213 <= dVar204) {
                            dVar204 = dVar213;
                          }
                        }
                        dVar213 = dVar204;
                        if ((uVar29 >> 0x1b & 1) != 0) {
                          iVar89 = 0;
                          dVar207 = dVar193;
                          bVar184 = true;
                          dVar213 = dVar193;
                          do {
                            bVar173 = bVar184;
                            iVar175 = iVar89 * 9 + 0xe;
                            lVar102 = -1;
                            do {
                              lVar91 = 0;
                              do {
                                if (((int)lVar91 != 1 || ((int)lVar102 != 0 || iVar89 != 0)) &&
                                   ((1 << ((char)iVar175 + (char)lVar91 & 0x1fU) & uVar29) != 0)) {
                                  dVar210 = pdVar32[lVar96 + (iVar105 + iVar89) * lVar34 +
                                                             (iVar86 + (int)lVar102) * lVar33 +
                                                             (long)(iVar129 + (int)lVar91)];
                                  dVar212 = dVar210;
                                  if (dVar210 <= dVar213) {
                                    dVar212 = dVar213;
                                  }
                                  dVar213 = dVar212;
                                  if (dVar210 < dVar207) {
                                    dVar207 = dVar210;
                                  }
                                }
                                lVar91 = lVar91 + 1;
                              } while (lVar91 != 3);
                              lVar102 = lVar102 + 1;
                              iVar175 = iVar175 + 3;
                            } while (lVar102 != 2);
                            iVar89 = 1;
                            bVar184 = false;
                          } while (bVar173);
                          dVar210 = ((0.5 - dVar200) * dVar199 +
                                    ((pdVar38 + lVar158 + lVar153 + (lVar90 - lVar167))[lVar41] -
                                    dVar209) * dVar201 +
                                    (pdVar38[lVar158 + lVar153 + (lVar90 - lVar167)] - dVar215) *
                                    dVar203 + dVar193) - dVar193;
                          if (dVar210 <= 1e-13) {
                            dVar213 = 1.0;
                            if ((dVar210 < -1e-13) &&
                               (dVar213 = (dVar207 - dVar193) / dVar210, 1.0 <= dVar213)) {
                              dVar213 = 1.0;
                            }
                          }
                          else {
                            dVar213 = (dVar213 - dVar193) / dVar210;
                            if (1.0 <= dVar213) {
                              dVar213 = 1.0;
                            }
                          }
                          if (dVar204 <= dVar213) {
                            dVar213 = dVar204;
                          }
                        }
                        dVar204 = dVar213;
                        if ((uVar29 >> 9 & 1) != 0) {
                          cVar144 = '\x05';
                          lVar102 = -1;
                          dVar204 = dVar193;
                          dVar207 = dVar193;
                          do {
                            lVar91 = -1;
                            cVar180 = cVar144;
                            do {
                              lVar103 = 0;
                              dVar210 = dVar204;
                              do {
                                dVar204 = dVar210;
                                if (((int)lVar103 != 1 || ((int)lVar91 != 0 || (int)lVar102 != 0))
                                   && ((1 << (cVar180 + (char)lVar103 & 0x1fU) & uVar29) != 0)) {
                                  dVar212 = pdVar32[lVar96 + (iVar105 + (int)lVar102) * lVar34 +
                                                             (iVar86 + (int)lVar91) * lVar33 +
                                                             (long)(iVar129 + (int)lVar103)];
                                  dVar204 = dVar212;
                                  if (dVar212 <= dVar210) {
                                    dVar204 = dVar210;
                                  }
                                  if (dVar212 < dVar207) {
                                    dVar207 = dVar212;
                                  }
                                }
                                lVar103 = lVar103 + 1;
                                dVar210 = dVar204;
                              } while (lVar103 != 3);
                              lVar91 = lVar91 + 1;
                              cVar180 = cVar180 + '\x03';
                            } while (lVar91 != 2);
                            cVar144 = cVar144 + '\t';
                            bVar184 = lVar102 != 0;
                            lVar102 = lVar102 + 1;
                          } while (bVar184);
                          dVar215 = ((((pdVar38 + lVar158 + lVar154 + (lVar90 - lVar167))[lVar41] -
                                      dVar209) * dVar201 +
                                     (pdVar38[lVar158 + lVar154 + (lVar90 - lVar167)] - dVar215) *
                                     dVar203 + dVar193) - (dVar200 + 0.5) * dVar199) - dVar193;
                          if (dVar215 <= 1e-13) {
                            dVar204 = 1.0;
                            if (dVar215 < -1e-13) {
                              dVar204 = (dVar207 - dVar193) / dVar215;
                              if (1.0 <= dVar204) {
                                dVar204 = 1.0;
                              }
                            }
                          }
                          else {
                            dVar204 = (dVar204 - dVar193) / dVar215;
                            if (1.0 <= dVar204) {
                              dVar204 = 1.0;
                            }
                          }
                          if (dVar213 <= dVar204) {
                            dVar204 = dVar213;
                          }
                        }
                        dVar215 = 0.0;
                        if (1 < iVar133) {
                          dVar215 = dVar204;
                        }
                        dVar200 = 0.0;
                        if (1 < iVar88) {
                          dVar200 = dVar204;
                        }
                        dVar213 = 0.0;
                        if (1 < iVar125) {
                          dVar213 = dVar204;
                        }
                        if ((local_8e8 == 1.0) && (!NAN(local_8e8))) {
                          if ((pdVar50[lVar115 + lVar128 + (int)(~uVar15 + iVar87)] == 1.0) &&
                             (((!NAN(pdVar50[lVar115 + lVar128 + (int)(~uVar15 + iVar87)]) &&
                               (pdVar50[lVar115 + lVar128 + (int)((iVar87 - uVar15) + 1)] == 1.0))
                              && (!NAN(pdVar50[lVar115 + lVar128 + (int)((iVar87 - uVar15) + 1)]))))
                             ) {
                            dVar215 = 1.0;
                          }
                          dVar200 = (double)(~-(ulong)(dVar211 == 1.0) & (ulong)dVar200 |
                                            (~-(ulong)(pdVar50[lVar128 + lVar141 + lVar142] == 1.0)
                                             & (ulong)dVar200 |
                                            -(ulong)(pdVar50[lVar128 + lVar141 + lVar142] == 1.0) &
                                            0x3ff0000000000000) & -(ulong)(dVar211 == 1.0));
                          if (((pdVar50[lVar115 + lVar142 + lVar113] == 1.0) &&
                              (!NAN(pdVar50[lVar115 + lVar142 + lVar113]))) &&
                             ((pdVar50[lVar115 + lVar142 + lVar114] == 1.0 &&
                              (!NAN(pdVar50[lVar115 + lVar142 + lVar114]))))) {
                            dVar213 = 1.0;
                          }
                        }
                        dVar211 = dVar205 * dVar199 * dVar213 +
                                  (0.5 - dVar209) * dVar201 * dVar200 +
                                  dVar192 * dVar203 * dVar215 + dVar193;
                        if (dVar211 <= dVar195) {
                          dVar195 = dVar211;
                        }
                        if (dVar214 <= dVar195) {
                          dVar214 = dVar195;
                        }
                        dVar214 = pdVar64[lVar157 + lVar147 + (lVar90 - lVar146)] * dVar186 * -0.5 *
                                  dVar201 * dVar200 + dVar214;
                      }
                      else {
                        local_988 = pdVar50 + lVar115 + lVar142;
                        if ((local_988[lVar128] != 1.0) || (NAN(local_988[lVar128])))
                        goto LAB_0042c6c5;
                        dVar187 = pdVar50[lVar128 + lVar117 + lVar142];
                        if ((((pdVar50[lVar128 + lVar116 + lVar142] != 1.0) ||
                             (NAN(pdVar50[lVar128 + lVar116 + lVar142]))) || (dVar187 != 1.0)) ||
                           (NAN(dVar187))) {
                          if ((dVar187 != 1.0) || (NAN(dVar187))) goto LAB_0042c6c5;
LAB_0042dd24:
                          lVar91 = lVar90 - lVar95;
                          dVar214 = pdVar32[lVar118 + lVar99 + lVar96 + lVar91];
                          dVar209 = dVar214 - pdVar32[lVar148 + lVar99 + lVar96 + lVar91];
                          dVar215 = pdVar32[lVar149 + lVar99 + lVar96 + lVar91] - dVar214;
                          dVar209 = dVar209 + dVar209;
                          dVar215 = dVar215 + dVar215;
                          dVar187 = (pdVar32[lVar149 + lVar99 + lVar96 + lVar91] -
                                    pdVar32[lVar148 + lVar99 + lVar96 + lVar91]) * 0.5;
                          dVar205 = ABS(dVar209);
                          uVar185 = -(ulong)(0.0 < dVar187);
                          dVar187 = ABS(dVar187);
                          dVar192 = ABS(dVar215);
                          if (dVar205 <= dVar187) {
                            dVar187 = dVar205;
                          }
                          if (dVar187 <= dVar192) {
                            dVar192 = dVar187;
                          }
                          uVar191 = -(ulong)(0.0 < dVar209 * dVar215) & (ulong)dVar192;
                          dVar187 = (double)(~uVar185 & (uVar191 ^ 0x8000000000000000) |
                                            uVar185 & uVar191) *
                                    (-1.0 - pdVar64[lVar157 + lVar147 + (lVar90 - lVar146)] *
                                            dVar186) * 0.5;
                        }
                        else {
                          if ((pdVar50[lVar128 + ((lVar179 + 2) - lVar170) * lVar51 + lVar142] !=
                               1.0) || (NAN(pdVar50[lVar128 + ((lVar179 + 2) - lVar170) * lVar51 +
                                                              lVar142]))) goto LAB_0042dd24;
                          lVar91 = lVar90 - lVar95;
                          dVar214 = pdVar32[lVar118 + lVar99 + lVar96 + lVar91];
                          dVar205 = dVar214 - pdVar32[lVar148 + lVar99 + lVar96 + lVar91];
                          dVar209 = pdVar32[lVar148 + lVar99 + lVar96 + lVar91] -
                                    pdVar32[lVar164 + lVar99 + lVar96 + lVar91];
                          dVar192 = 0.0;
                          dVar187 = 0.0;
                          if (0.0 <= dVar205 * dVar209) {
                            dVar187 = ABS(dVar205);
                            if (ABS(dVar209) <= ABS(dVar205)) {
                              dVar187 = ABS(dVar209);
                            }
                            dVar187 = dVar187 + dVar187;
                          }
                          dVar200 = pdVar32[lVar96 + lVar99 + ((lVar179 + 2) - lVar161) * lVar33 +
                                                              lVar91] -
                                    pdVar32[lVar149 + lVar99 + lVar96 + lVar91];
                          dVar213 = pdVar32[lVar149 + lVar99 + lVar96 + lVar91] - dVar214;
                          dVar215 = (dVar213 + dVar200) * 0.5;
                          if (0.0 <= dVar213 * dVar200) {
                            dVar192 = ABS(dVar200);
                            if (ABS(dVar213) <= ABS(dVar200)) {
                              dVar192 = ABS(dVar213);
                            }
                            dVar192 = dVar192 + dVar192;
                          }
                          dVar193 = (dVar205 + dVar213) * 0.5;
                          dVar200 = 0.0;
                          if (0.0 <= dVar205 * dVar213) {
                            dVar200 = ABS(dVar213);
                            if (ABS(dVar205) <= ABS(dVar213)) {
                              dVar200 = ABS(dVar205);
                            }
                            dVar200 = dVar200 + dVar200;
                          }
                          dVar209 = (dVar205 + dVar209) * 0.5;
                          dVar205 = ABS(dVar209);
                          if (dVar187 <= dVar205) {
                            dVar205 = dVar187;
                          }
                          dVar187 = ABS(dVar215);
                          if (dVar192 <= dVar187) {
                            dVar187 = dVar192;
                          }
                          dVar187 = ABS(dVar193 * 1.3333333333333333 +
                                        (dVar187 * (double)((ulong)dVar215 & 0x8000000000000000 |
                                                           0x3ff0000000000000) +
                                        dVar205 * (double)((ulong)dVar209 & 0x8000000000000000 |
                                                          0x3ff0000000000000)) *
                                        -0.16666666666666666);
                          if (dVar200 <= dVar187) {
                            dVar187 = dVar200;
                          }
                          dVar187 = dVar187 * (double)((ulong)dVar193 & 0x8000000000000000 |
                                                      0x3ff0000000000000) *
                                    (-1.0 - pdVar64[lVar157 + lVar147 + (lVar90 - lVar146)] *
                                            dVar186) * 0.5;
                        }
                        dVar187 = dVar187 + dVar214;
LAB_0042de11:
                        dVar214 = pdVar50[lVar128 + lVar141 + lVar142];
                        if ((((dVar214 != 1.0) || (NAN(dVar214))) ||
                            (pdVar50[lVar128 + ((iVar174 + -3) - iVar13) * lVar51 + lVar142] != 1.0)
                            ) || (NAN(pdVar50[lVar128 + ((iVar174 + -3) - iVar13) * lVar51 + lVar142
                                             ]))) {
                          if (((dVar211 != 1.0) || (NAN(dVar211))) ||
                             ((dVar214 != 1.0 || (NAN(dVar214))))) goto LAB_0042e196;
LAB_0042e0af:
                          lVar102 = lVar90 - lVar95;
                          dVar211 = pdVar32[lVar148 + lVar99 + lVar96 + lVar102];
                          dVar205 = dVar211 - pdVar32[lVar96 + lVar99 + lVar130 + lVar102];
                          dVar209 = pdVar32[lVar118 + lVar99 + lVar96 + lVar102] - dVar211;
                          dVar205 = dVar205 + dVar205;
                          dVar209 = dVar209 + dVar209;
                          dVar214 = (pdVar32[lVar118 + lVar99 + lVar96 + lVar102] -
                                    pdVar32[lVar96 + lVar99 + lVar130 + lVar102]) * 0.5;
                          dVar215 = ABS(dVar205);
                          uVar185 = -(ulong)(0.0 < dVar214);
                          dVar214 = ABS(dVar214);
                          dVar192 = ABS(dVar209);
                          if (dVar215 <= dVar214) {
                            dVar214 = dVar215;
                          }
                          if (dVar214 <= dVar192) {
                            dVar192 = dVar214;
                          }
                          uVar191 = -(ulong)(0.0 < dVar205 * dVar209) & (ulong)dVar192;
                          dVar214 = (double)(~uVar185 & (uVar191 ^ 0x8000000000000000) |
                                            uVar185 & uVar191) *
                                    (1.0 - pdVar64[lVar157 + lVar147 + (lVar90 - lVar146)] * dVar186
                                    ) * 0.5;
                        }
                        else {
                          if ((dVar211 != 1.0) || (NAN(dVar211))) {
LAB_0042e196:
                            bVar184 = true;
                            local_8e8 = 1.0;
                            goto LAB_0042e1ac;
                          }
                          if ((pdVar50[lVar128 + lVar140 + lVar142] != 1.0) ||
                             (NAN(pdVar50[lVar128 + lVar140 + lVar142]))) goto LAB_0042e0af;
                          lVar102 = lVar90 - lVar95;
                          dVar211 = pdVar32[lVar148 + lVar99 + lVar96 + lVar102];
                          dVar205 = dVar211 - pdVar32[lVar96 + lVar99 + lVar130 + lVar102];
                          dVar209 = pdVar32[lVar96 + lVar99 + lVar130 + lVar102] -
                                    pdVar32[lVar96 + lVar99 + ((iVar174 + -3) - iVar176) * lVar33 +
                                                              lVar102];
                          dVar192 = 0.0;
                          dVar214 = 0.0;
                          if (0.0 <= dVar205 * dVar209) {
                            dVar214 = ABS(dVar205);
                            if (ABS(dVar209) <= ABS(dVar205)) {
                              dVar214 = ABS(dVar209);
                            }
                            dVar214 = dVar214 + dVar214;
                          }
                          dVar215 = pdVar32[lVar96 + lVar99 + (iVar124 - iVar176) * lVar33 + lVar102
                                           ] - pdVar32[lVar118 + lVar99 + lVar96 + lVar102];
                          dVar213 = pdVar32[lVar118 + lVar99 + lVar96 + lVar102] - dVar211;
                          dVar200 = (dVar213 + dVar215) * 0.5;
                          if (0.0 <= dVar213 * dVar215) {
                            dVar192 = ABS(dVar215);
                            if (ABS(dVar213) <= ABS(dVar215)) {
                              dVar192 = ABS(dVar213);
                            }
                            dVar192 = dVar192 + dVar192;
                          }
                          dVar193 = (dVar205 + dVar213) * 0.5;
                          dVar215 = 0.0;
                          if (0.0 <= dVar205 * dVar213) {
                            dVar215 = ABS(dVar213);
                            if (ABS(dVar205) <= ABS(dVar213)) {
                              dVar215 = ABS(dVar205);
                            }
                            dVar215 = dVar215 + dVar215;
                          }
                          dVar209 = (dVar205 + dVar209) * 0.5;
                          dVar205 = ABS(dVar209);
                          if (dVar214 <= dVar205) {
                            dVar205 = dVar214;
                          }
                          dVar214 = ABS(dVar200);
                          if (dVar192 <= dVar214) {
                            dVar214 = dVar192;
                          }
                          dVar214 = ABS(dVar193 * 1.3333333333333333 +
                                        (dVar214 * (double)((ulong)dVar200 & 0x8000000000000000 |
                                                           0x3ff0000000000000) +
                                        dVar205 * (double)((ulong)dVar209 & 0x8000000000000000 |
                                                          0x3ff0000000000000)) *
                                        -0.16666666666666666);
                          if (dVar215 <= dVar214) {
                            dVar214 = dVar215;
                          }
                          dVar214 = dVar214 * (double)((ulong)dVar193 & 0x8000000000000000 |
                                                      0x3ff0000000000000) *
                                    (1.0 - pdVar64[lVar157 + lVar147 + (lVar90 - lVar146)] * dVar186
                                    ) * 0.5;
                        }
                        dVar214 = dVar214 + dVar211;
                      }
                    }
                    pdVar56[local_880 * lVar59 +
                            (lVar92 - iVar18) * lVar58 +
                            (int)(~uVar19 + iVar174) * lVar57 + (lVar90 - iVar20)] = dVar214;
                    pdVar60[local_880 * lVar63 +
                            (lVar92 - iVar21) * lVar62 +
                            (lVar179 - iVar22) * lVar61 + (lVar90 - iVar23)] = dVar187;
                    lVar90 = lVar90 + 1;
                    pdVar155 = pdVar155 + 1;
                    pdVar150 = pdVar150 + 1;
                    pdVar159 = pdVar159 + 1;
                    iVar129 = iVar129 + 1;
                    iVar80 = iVar80 + 1;
                  } while (iVar6 + 1 != (int)lVar90);
                }
                lVar179 = lVar179 + 1;
              } while ((int)uVar100 != iVar8 + 1);
            }
            lVar92 = lVar92 + 1;
          } while (iVar7 + 1 != (int)uVar97);
        }
        local_880 = local_880 + 1;
      } while (local_880 != (uint)ncomp);
    }
  }
  else {
    local_3b8.q.p = q->p;
    local_3b8.q.jstride = q->jstride;
    local_3b8.q.kstride = q->kstride;
    local_3b8.q.nstride = q->nstride;
    local_3b8.q.begin.x = (q->begin).x;
    local_3b8.q.begin.y = (q->begin).y;
    uVar67 = *(undefined8 *)&(q->begin).z;
    uVar68 = (q->end).y;
    local_3b8.q._52_8_ = *(undefined8 *)&(q->end).z;
    local_3b8.q.begin.z = (int)uVar67;
    local_3b8.q.end.x = (int)((ulong)uVar67 >> 0x20);
    local_3b8.vmac.p = vmac->p;
    local_3b8.vmac.jstride = vmac->jstride;
    local_3b8.vmac.kstride = vmac->kstride;
    local_3b8.vmac.nstride = vmac->nstride;
    local_3b8.vmac.begin.x = (vmac->begin).x;
    local_3b8.vmac.begin.y = (vmac->begin).y;
    uVar69 = (vmac->end).x;
    uVar70 = (vmac->end).y;
    local_3b8.vmac._52_8_ = *(undefined8 *)&(vmac->end).z;
    local_3b8.vmac.begin.z = (int)*(undefined8 *)&(vmac->begin).z;
    local_3b8.Imy.p = Imy->p;
    local_3b8.Imy.jstride = Imy->jstride;
    local_3b8.Imy.kstride = Imy->kstride;
    local_3b8.Imy.nstride = Imy->nstride;
    local_3b8.Imy.begin.x = (Imy->begin).x;
    local_3b8.Imy.begin.y = (Imy->begin).y;
    uVar67 = *(undefined8 *)&(Imy->begin).z;
    uVar71 = (Imy->end).y;
    local_3b8.Imy._52_8_ = *(undefined8 *)&(Imy->end).z;
    local_3b8.Imy.begin.z = (int)uVar67;
    local_3b8.Imy.end.x = (int)((ulong)uVar67 >> 0x20);
    local_3b8.Ipy.p = Ipy->p;
    local_3b8.Ipy.jstride = Ipy->jstride;
    local_3b8.Ipy.kstride = Ipy->kstride;
    local_3b8.Ipy.nstride = Ipy->nstride;
    local_3b8.Ipy.begin.x = (Ipy->begin).x;
    local_3b8.Ipy.begin.y = (Ipy->begin).y;
    uVar72 = (Ipy->end).x;
    uVar73 = (Ipy->end).y;
    local_3b8.Ipy._52_8_ = *(undefined8 *)&(Ipy->end).z;
    local_3b8.Ipy.begin.z = (int)*(undefined8 *)&(Ipy->begin).z;
    local_3b8.pbc = pbc;
    local_3b8.flag.p = flag->p;
    local_3b8.flag.jstride = flag->jstride;
    local_3b8.flag.kstride = flag->kstride;
    local_3b8.flag.nstride = flag->nstride;
    local_3b8.flag.begin.x = (flag->begin).x;
    local_3b8.flag.begin.y = (flag->begin).y;
    uVar67 = *(undefined8 *)&(flag->begin).z;
    uVar74 = (flag->end).y;
    local_3b8.flag._52_8_ = *(undefined8 *)&(flag->end).z;
    local_3b8.flag.begin.z = (int)uVar67;
    local_3b8.flag.end.x = (int)((ulong)uVar67 >> 0x20);
    local_3b8.vfrac.p = vfrac->p;
    local_3b8.vfrac.jstride = vfrac->jstride;
    local_3b8.vfrac.kstride = vfrac->kstride;
    local_3b8.vfrac.nstride = vfrac->nstride;
    local_3b8.vfrac.begin.x = (vfrac->begin).x;
    local_3b8.vfrac.begin.y = (vfrac->begin).y;
    uVar67 = *(undefined8 *)&(vfrac->begin).z;
    uVar75 = (vfrac->end).y;
    local_3b8.vfrac._52_8_ = *(undefined8 *)&(vfrac->end).z;
    local_3b8.vfrac.begin.z = (int)uVar67;
    local_3b8.vfrac.end.x = (int)((ulong)uVar67 >> 0x20);
    local_3b8.ccc.p = ccc->p;
    local_3b8.ccc.jstride = ccc->jstride;
    local_3b8.ccc.kstride = ccc->kstride;
    local_3b8.ccc.nstride = ccc->nstride;
    local_3b8.ccc.begin.x = (ccc->begin).x;
    local_3b8.ccc.begin.y = (ccc->begin).y;
    uVar67 = *(undefined8 *)&(ccc->begin).z;
    uVar76 = (ccc->end).y;
    local_3b8.ccc._52_8_ = *(undefined8 *)&(ccc->end).z;
    local_3b8.ccc.begin.z = (int)uVar67;
    local_3b8.ccc.end.x = (int)((ulong)uVar67 >> 0x20);
    local_3b8.fcx.p = fcx->p;
    local_3b8.fcx.jstride = fcx->jstride;
    local_3b8.fcx.kstride = fcx->kstride;
    local_3b8.fcx.nstride = fcx->nstride;
    local_3b8.fcx.begin.x = (fcx->begin).x;
    local_3b8.fcx.begin.y = (fcx->begin).y;
    uVar67 = *(undefined8 *)&(fcx->begin).z;
    uVar77 = (fcx->end).y;
    local_3b8.fcx._52_8_ = *(undefined8 *)&(fcx->end).z;
    local_3b8.fcx.begin.z = (int)uVar67;
    local_3b8.fcx.end.x = (int)((ulong)uVar67 >> 0x20);
    local_3b8.fcy.p = fcy->p;
    local_3b8.fcy.jstride = fcy->jstride;
    local_3b8.fcy.kstride = fcy->kstride;
    local_3b8.fcy.nstride = fcy->nstride;
    local_3b8.fcy.begin.x = (fcy->begin).x;
    local_3b8.fcy.begin.y = (fcy->begin).y;
    uVar67 = *(undefined8 *)&(fcy->begin).z;
    uVar78 = (fcy->end).y;
    local_3b8.fcy._52_8_ = *(undefined8 *)&(fcy->end).z;
    local_3b8.fcy.begin.z = (int)uVar67;
    local_3b8.fcy.end.x = (int)((ulong)uVar67 >> 0x20);
    local_3b8.fcz.p = fcz->p;
    local_3b8.fcz.jstride = fcz->jstride;
    local_3b8.fcz.kstride = fcz->kstride;
    local_3b8.fcz.nstride = fcz->nstride;
    local_3b8.fcz.begin.x = (fcz->begin).x;
    local_3b8.fcz.begin.y = (fcz->begin).y;
    uVar67 = *(undefined8 *)&(fcz->begin).z;
    uVar79 = (fcz->end).y;
    local_3b8.fcz._52_8_ = *(undefined8 *)&(fcz->end).z;
    local_3b8.fcz.begin.z = (int)uVar67;
    local_3b8.fcz.end.x = (int)((ulong)uVar67 >> 0x20);
    local_3b8.is_velocity = is_velocity;
    if (0 < ncomp) {
      iVar6 = (yebox->smallend).vect[0];
      iVar7 = (yebox->smallend).vect[1];
      iVar8 = (yebox->smallend).vect[2];
      iVar9 = (yebox->bigend).vect[2];
      iVar10 = (yebox->bigend).vect[0];
      iVar11 = (yebox->bigend).vect[1];
      iVar126 = 0;
      local_3b8.q.end.y = uVar68;
      local_3b8.vmac.end.x = uVar69;
      local_3b8.vmac.end.y = uVar70;
      local_3b8.domain_ilo = iVar181;
      local_3b8.domain_jlo = iVar165;
      local_3b8.domain_klo = iVar4;
      local_3b8.domain_ihi = iVar176;
      local_3b8.domain_jhi = iVar3;
      local_3b8.domain_khi = iVar5;
      local_3b8.Imy.end.y = uVar71;
      local_3b8.Ipy.end.x = uVar72;
      local_3b8.Ipy.end.y = uVar73;
      local_3b8.dtdy = dVar186;
      local_3b8.flag.end.y = uVar74;
      local_3b8.vfrac.end.y = uVar75;
      local_3b8.ccc.end.y = uVar76;
      local_3b8.fcx.end.y = uVar77;
      local_3b8.fcy.end.y = uVar78;
      local_3b8.fcz.end.y = uVar79;
      do {
        iVar181 = iVar8;
        if (iVar8 <= iVar9) {
          do {
            iVar165 = iVar7;
            if (iVar7 <= iVar11) {
              do {
                iVar176 = iVar6;
                if (iVar6 <= iVar10) {
                  do {
                    PredictStateOnYFace::anon_class_688_19_b0541dda::operator()
                              (&local_3b8,iVar176,iVar165,iVar181,iVar126);
                    iVar176 = iVar176 + 1;
                  } while (iVar10 + 1 != iVar176);
                }
                bVar184 = iVar165 != iVar11;
                iVar165 = iVar165 + 1;
              } while (bVar184);
            }
            bVar184 = iVar181 != iVar9;
            iVar181 = iVar181 + 1;
          } while (bVar184);
        }
        iVar126 = iVar126 + 1;
      } while (iVar126 != ncomp);
    }
  }
  return;
}

Assistant:

void
EBPLM::PredictStateOnYFace ( Box const& yebox, int ncomp,
                             Array4<Real> const& Imy, Array4<Real> const& Ipy,
                             Array4<Real const> const& q,
                             Array4<Real const> const& vmac,
                             Array4<EBCellFlag const> const& flag,
                             Array4<Real const> const& vfrac,
                             AMREX_D_DECL(Array4<Real const> const& fcx,
                                          Array4<Real const> const& fcy,
                                          Array4<Real const> const& fcz),
                             Array4<Real const> const& ccc,
                             Geometry const& geom,
                             Real dt,
                             Vector<BCRec> const& h_bcrec,
                             BCRec const* pbc, bool is_velocity)
{
    const Real dy = geom.CellSize(1);
    const Real dtdy = dt/dy;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);
    const int domain_jlo = domain_box.smallEnd(1);
    const int domain_jhi = domain_box.bigEnd(1);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi_x = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::x));
    auto extdir_lohi_y = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::y));

    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;

#if (AMREX_SPACEDIM == 3)
    const int domain_klo = domain_box.smallEnd(2);
    const int domain_khi = domain_box.bigEnd(2);
    auto extdir_lohi_z = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;
#endif

    if ( (has_extdir_or_ho_lo_x && domain_ilo >= yebox.smallEnd(0)-1) ||
         (has_extdir_or_ho_hi_x && domain_ihi <= yebox.bigEnd(0)    ) ||
#if (AMREX_SPACEDIM == 3)
         (has_extdir_or_ho_lo_z && domain_klo >= yebox.smallEnd(2)-1) ||
         (has_extdir_or_ho_hi_z && domain_khi <= yebox.bigEnd(2)    ) ||
#endif
         (has_extdir_or_ho_lo_y && domain_jlo >= yebox.smallEnd(1)-1) ||
         (has_extdir_or_ho_hi_y && domain_jhi <= yebox.bigEnd(1)    )  )
    {
        amrex::ParallelFor(yebox, ncomp, [q,vmac,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imy,Ipy,dtdy,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                          is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apy(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                const auto& bc = pbc[n];
                bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                        (bc.lo(0) == BCType::hoextrap);
                bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                        (bc.hi(0) == BCType::hoextrap);
                bool extdir_or_ho_jlo = (bc.lo(1) == BCType::ext_dir) ||
                                        (bc.lo(1) == BCType::hoextrap);
                bool extdir_or_ho_jhi = (bc.hi(1) == BCType::ext_dir) ||
                                        (bc.hi(1) == BCType::hoextrap);
#if (AMREX_SPACEDIM == 3)
                bool extdir_or_ho_klo = (bc.lo(2) == BCType::ext_dir) ||
                                        (bc.lo(2) == BCType::hoextrap);
                bool extdir_or_ho_khi = (bc.hi(2) == BCType::ext_dir) ||
                                        (bc.hi(2) == BCType::hoextrap);
#endif

                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. &&
                                          vfrac(i,j+1,k) == 1. && vfrac(i,j+2,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j  ,k,n) + 0.5 * (-1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope_extdir(i,j,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j+1,k) == 1.) {

                    int order = 2;
                    qpls = q(i,j  ,k,n) + 0.5 * (-1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope_extdir(i,j,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = 0.5 + ccc(i,j,k,1);,
                                Real delta_x = xf  - ccc(i,j,k,0);,
                                Real delta_z = zf  - ccc(i,j,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) - delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) - delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);
                   qpls -= 0.5 * dtdy * vmac(i,j,k) * slopes_eb_hi[1];

                }  // end of making qpls

                // Only over-write normal velocity with Dirichlet bc at lo face
                if (j == domain_jlo && (bc.lo(1) == BCType::ext_dir))
                    if (is_velocity && n == 1) qpls = q(i,j-1,k,n);

                // Over-write all with Dirichlet bc at hi face
                if (j == domain_jhi+1 && (bc.hi(1) == BCType::ext_dir))
                    qpls = q(i,j,k,n);

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j-1,k) with all values at cell centers
                if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j-3,k) == 1. &&
                                            vfrac(i,j  ,k) == 1. && vfrac(i,j+1,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope_extdir(i,j-1,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j  ,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope_extdir(i,j-1,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = 0.5 - ccc(i,j-1,k,1);,
                                Real delta_x = xf  - ccc(i,j-1,k,0);,
                                Real delta_z = zf  - ccc(i,j-1,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j-1,k,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);


#if (AMREX_SPACEDIM == 3)
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);
                   qmns -= 0.5 * dtdy * vmac(i,j,k) * slopes_eb_lo[1];

                }  // end of making qmns

                // Over-write all with Dirichlet bc at lo face
                if (j == domain_jlo && (bc.lo(1) == BCType::ext_dir))
                    qmns = q(i,j-1,k,n);

                // Only over-write normal velocity with Dirichlet bc at hi face
                if (j == domain_jhi+1 && (bc.hi(1) == BCType::ext_dir))
                    if (is_velocity && n == 1) qmns = q(i,j,k,n);
            }

            Ipy(i,j-1,k,n) = qmns;
            Imy(i,j  ,k,n) = qpls;
        });
    }
    else // The cases below are not near any domain boundary
    {
        amrex::ParallelFor(yebox, ncomp, [q,vmac,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imy,Ipy,dt,dtdy,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                          is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apy(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. &&
                                          vfrac(i,j+1,k) == 1. && vfrac(i,j+2,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope(i,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j+1,k) == 1.) {

                    int order = 2;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope(i,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = 0.5 + ccc(i,j,k,1);,
                                Real delta_x = xf  - ccc(i,j,k,0);,
                                Real delta_z = zf  - ccc(i,j,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) - delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) - delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);
                   qpls -= 0.5 * dtdy * vmac(i,j,k) * slopes_eb_hi[1];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j-1,k) with all values at cell centers
                if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j-3,k) == 1. &&
                                            vfrac(i,j  ,k) == 1. && vfrac(i,j+1,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope(i,j-1,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j  ,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope(i,j-1,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = 0.5 - ccc(i,j-1,k,1);,
                                Real delta_x = xf  - ccc(i,j-1,k,0);,
                                Real delta_z = zf  - ccc(i,j-1,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j-1,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);
                   qmns -= 0.5 * dtdy * vmac(i,j,k) * slopes_eb_lo[1];

                }  // end of making qmns
            }

            Ipy(i,j-1,k,n) = qmns;
            Imy(i,j  ,k,n) = qpls;
        });
    }
}